

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
itlib::small_vector<long,_4UL,_0UL,_std::allocator<long>_>::resize
          (small_vector<long,_4UL,_0UL,_std::allocator<long>_> *this,size_type n)

{
  long *plVar1;
  long *plVar2;
  ulong uVar3;
  size_t sVar4;
  size_type sVar5;
  long *plVar6;
  ulong uVar7;
  
  plVar2 = choose_data(this,n);
  plVar1 = this->m_begin;
  if (plVar2 == plVar1) {
    plVar1 = plVar1 + n;
    plVar2 = this->m_end;
    if (plVar1 < plVar2) {
      do {
        plVar2 = plVar2 + -1;
      } while (plVar1 < plVar2);
      this->m_end = plVar2;
    }
    plVar2 = this->m_end;
    if (plVar1 <= plVar2) {
      return;
    }
    plVar6 = plVar2 + 1;
    if (plVar2 + 1 < plVar1) {
      plVar6 = plVar1;
    }
    uVar3 = ~(ulong)plVar2 + (long)plVar6 & 0xfffffffffffffff8;
    memset(plVar2,0,uVar3 + 8);
    plVar2 = (long *)((long)plVar2 + uVar3 + 8);
  }
  else {
    uVar3 = (long)this->m_end - (long)plVar1 >> 3;
    sVar5 = n;
    if (uVar3 < n) {
      sVar5 = uVar3;
    }
    if (sVar5 != 0) {
      uVar7 = 0;
      do {
        plVar2[uVar7] = plVar1[uVar7];
        uVar7 = uVar7 + 1;
      } while (sVar5 != uVar7);
    }
    if (uVar3 < n) {
      memset(plVar2 + sVar5,0,(n - sVar5) * 8);
    }
    if ((type *)plVar2 == this->m_static_data) {
      sVar4 = 4;
    }
    else {
      if ((type *)plVar1 != this->m_static_data) {
        operator_delete(plVar1,this->m_capacity << 3);
      }
      sVar4 = this->m_dynamic_capacity;
    }
    this->m_capacity = sVar4;
    this->m_begin = plVar2;
    plVar2 = plVar2 + n;
  }
  this->m_end = plVar2;
  return;
}

Assistant:

void resize(size_type n)
    {
        auto new_buf = choose_data(n);

        if (new_buf == m_begin)
        {
            // no special transfers needed

            auto new_end = m_begin + n;

            while (m_end > new_end)
            {
                atraits::destroy(get_alloc(), --m_end);
            }

            while (new_end > m_end)
            {
                atraits::construct(get_alloc(), m_end++);
            }
        }
        else
        {
            // we need to transfer the elements into the new buffer

            const auto s = size();
            const auto num_transfer = n < s ? n : s;

            for (size_type i = 0; i < num_transfer; ++i)
            {
                atraits::construct(get_alloc(), new_buf + i, std::move(*(m_begin + i)));
            }

            // free obsoletes
            for (size_type i = 0; i < s; ++i)
            {
                atraits::destroy(get_alloc(), m_begin + i);
            }

            // construct new elements
            for (size_type i = num_transfer; i < n; ++i)
            {
                atraits::construct(get_alloc(), new_buf + i);
            }

            if (new_buf == static_begin_ptr())
            {
                m_capacity = StaticCapacity;
            }
            else
            {
                if (m_begin != static_begin_ptr())
                {
                    // we've moved from dyn to dyn memory, so deallocate the old one
                    atraits::deallocate(get_alloc(), m_begin, m_capacity);
                }
                m_capacity = m_dynamic_capacity;
            }

            m_begin = new_buf;
            m_end = new_buf + n;
        }
    }